

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O0

int deqp::gles3::Functional::FboTestUtil::calculateU8ConversionError(int srcBits)

{
  int iVar1;
  float fVar2;
  int error;
  int srcMaxValue;
  int clampedBits;
  int srcBits_local;
  
  if (srcBits < 1) {
    clampedBits = 1;
  }
  else {
    iVar1 = de::clamp<int>(srcBits,0,8);
    iVar1 = de::max<int>((1 << ((byte)iVar1 & 0x1f)) + -1,1);
    fVar2 = ::deFloatCeil(510.0 / (float)iVar1);
    clampedBits = de::clamp<int>((int)fVar2,0,0xff);
  }
  return clampedBits;
}

Assistant:

static int calculateU8ConversionError (int srcBits)
{
	if (srcBits > 0)
	{
		const int clampedBits	= de::clamp<int>(srcBits, 0, 8);
		const int srcMaxValue	= de::max((1<<clampedBits) - 1, 1);
		const int error			= int(deFloatCeil(255.0f * 2.0f / float(srcMaxValue)));

		return de::clamp<int>(error, 0, 255);
	}
	else
		return 1;
}